

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

ArrayPtr<const_char> kj::_::safeUnixPath(sockaddr_un *addr,uint addrlen)

{
  size_t sVar1;
  ArrayPtr<const_char> AVar2;
  Fault f;
  uint addrlen_local;
  DebugComparison<const_unsigned_short_&,_int> _kjCondition;
  
  _kjCondition.result = addr->sun_family == 1;
  _kjCondition.right = 1;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  addrlen_local = addrlen;
  if (!_kjCondition.result) {
    _kjCondition.left = &addr->sun_family;
    Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short_const&,int>&,char_const(&)[19]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0xbaa,FAILED,"addr->sun_family == AF_UNIX","_kjCondition,\"not a unix address\"",
               &_kjCondition,(char (*) [19])"not a unix address");
    Debug::Fault::fatal(&f);
  }
  _kjCondition.result = 1 < addrlen;
  _kjCondition.left = (unsigned_short *)&addrlen_local;
  _kjCondition.right = 2;
  _kjCondition._12_4_ = 0;
  _kjCondition.op.content.ptr = " >= ";
  _kjCondition.op.content.size_ = 5;
  if (_kjCondition.result) {
    sVar1 = (ulong)addrlen - 2;
    if ((sVar1 == 0) || (addr->sun_path[0] != '\0')) {
      sVar1 = strnlen(addr->sun_path,sVar1);
    }
    else {
      sVar1 = strnlen(addr->sun_path + 1,(ulong)addrlen - 3);
      sVar1 = sVar1 + 1;
    }
    AVar2.size_ = sVar1;
    AVar2.ptr = addr->sun_path;
    return AVar2;
  }
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_long>&,char_const(&)[21]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0xbab,FAILED,"addrlen >= offsetof(sockaddr_un, sun_path)",
             "_kjCondition,\"invalid unix address\"",
             (DebugComparison<unsigned_int_&,_unsigned_long> *)&_kjCondition,
             (char (*) [21])"invalid unix address");
  Debug::Fault::fatal(&f);
}

Assistant:

kj::ArrayPtr<const char> safeUnixPath(const struct sockaddr_un* addr, uint addrlen) {
  KJ_REQUIRE(addr->sun_family == AF_UNIX, "not a unix address");
  KJ_REQUIRE(addrlen >= offsetof(sockaddr_un, sun_path), "invalid unix address");

  size_t maxPathlen = addrlen - offsetof(sockaddr_un, sun_path);

  size_t pathlen;
  if (maxPathlen > 0 && addr->sun_path[0] == '\0') {
    // Linux "abstract" unix address
    pathlen = strnlen(addr->sun_path + 1, maxPathlen - 1) + 1;
  } else {
    pathlen = strnlen(addr->sun_path, maxPathlen);
  }
  return kj::arrayPtr(addr->sun_path, pathlen);
}